

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.h
# Opt level: O2

ostream * wasm::operator<<(ostream *os,RepeatedSubstring *substring)

{
  ostream *poVar1;
  uint uVar2;
  
  poVar1 = std::operator<<(os,"SuffixTree::RepeatedSubstring{");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"u, (std::vector<unsigned>{");
  for (uVar2 = 0;
      (ulong)uVar2 <
      (ulong)((long)(substring->StartIndices).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(substring->StartIndices).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2); uVar2 = uVar2 + 1) {
    std::ostream::_M_insert<unsigned_long>((ulong)os);
    if (((long)(substring->StartIndices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(substring->StartIndices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start >> 2) - 1U != (ulong)uVar2) {
      std::operator<<(os,", ");
    }
  }
  poVar1 = std::operator<<(os,"})}");
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os,
                                  RepeatedSubstring substring) {
    os << "SuffixTree::RepeatedSubstring{" << substring.Length
       << "u, (std::vector<unsigned>{";
    for (unsigned idx = 0; idx < substring.StartIndices.size(); idx++) {
      os << substring.StartIndices[idx];
      if (idx != substring.StartIndices.size() - 1) {
        os << ", ";
      }
    }
    return os << "})}";
  }